

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

int KBHit(void)

{
  ssize_t sVar1;
  byte local_d;
  int nread;
  uchar ch;
  
  tcgetattr(0,(termios *)&KBHit::initial_settings);
  memcpy(&KBHit::new_settings,&KBHit::initial_settings,0x3c);
  KBHit::new_settings.c_lflag = KBHit::new_settings.c_lflag & 0xfffffff4;
  KBHit::new_settings.c_cc[6] = '\x01';
  KBHit::new_settings.c_cc[5] = '\0';
  tcsetattr(0,0,(termios *)&KBHit::new_settings);
  KBHit::new_settings.c_cc[6] = '\0';
  tcsetattr(0,0,(termios *)&KBHit::new_settings);
  sVar1 = read(0,&local_d,1);
  KBHit::new_settings.c_cc[6] = '\x01';
  tcsetattr(0,0,(termios *)&KBHit::initial_settings);
  if ((int)sVar1 == 1) {
    nread = (int)local_d;
  }
  else {
    nread = 0;
  }
  return nread;
}

Assistant:

int	KBHit()
{
#ifdef WIN32
	if(kbhit())	return	getch();
#else
	static struct termios initial_settings, new_settings;

	tcgetattr(0,&initial_settings);
	new_settings = initial_settings;
	new_settings.c_lflag &= ~ICANON;
	new_settings.c_lflag &= ~ECHO;
	new_settings.c_lflag &= ~ISIG;
	new_settings.c_cc[VMIN] = 1;
	new_settings.c_cc[VTIME] = 0;
	tcsetattr(0, TCSANOW, &new_settings);

	unsigned char ch;

	new_settings.c_cc[VMIN]=0;
	tcsetattr(0, TCSANOW, &new_settings);
	int nread = read(0,&ch,1);
	new_settings.c_cc[VMIN]=1;
	tcsetattr(0, TCSANOW, &initial_settings);
	if(nread == 1)	return	ch;
#endif
	return 0;
}